

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.cpp
# Opt level: O2

UChar * icu_63::UCharsTrie::findUniqueValueFromBranch
                  (UChar *pos,int32_t length,UBool haveUniqueValue,int32_t *uniqueValue)

{
  UChar UVar1;
  UBool UVar2;
  int32_t iVar3;
  char16_t *pos_00;
  UChar *pUVar4;
  int iVar5;
  ulong uVar6;
  ushort uVar7;
  uint leadUnit;
  UChar *pUVar8;
  
  uVar6 = (ulong)(uint)length;
  while (pUVar8 = pos, iVar5 = (int)uVar6, 5 < iVar5) {
    pos_00 = jumpByDelta(pUVar8 + 1);
    iVar3 = (int32_t)(uVar6 >> 1);
    pUVar4 = findUniqueValueFromBranch(pos_00,iVar3,haveUniqueValue,uniqueValue);
    if (pUVar4 == (UChar *)0x0) {
      return (UChar *)0x0;
    }
    uVar6 = (ulong)(uint)(iVar5 - iVar3);
    pos = pUVar8 + 2;
    if (0xfbff < (ushort)pUVar8[1]) {
      if (pUVar8[1] == L'\xffff') {
        pos = pUVar8 + 4;
      }
      else {
        pos = pUVar8 + 3;
      }
    }
  }
  iVar5 = iVar5 + 1;
  do {
    pUVar4 = pUVar8 + 2;
    UVar1 = pUVar8[1];
    leadUnit = (ushort)UVar1 & 0x7fff;
    iVar3 = readValue(pUVar4,leadUnit);
    uVar7 = (ushort)leadUnit;
    if (0x3fff < uVar7) {
      if (uVar7 == 0x7fff) {
        pUVar4 = pUVar8 + 4;
      }
      else {
        pUVar4 = pUVar8 + 3;
      }
    }
    if (UVar1 < L'\0') {
      if (haveUniqueValue == '\0') {
        *uniqueValue = iVar3;
        haveUniqueValue = '\x01';
      }
      else if (iVar3 != *uniqueValue) {
        return (UChar *)0x0;
      }
    }
    else {
      UVar2 = findUniqueValue(pUVar4 + iVar3,haveUniqueValue,uniqueValue);
      haveUniqueValue = '\x01';
      if (UVar2 == '\0') {
        return (UChar *)0x0;
      }
    }
    iVar5 = iVar5 + -1;
    pUVar8 = pUVar4;
  } while (2 < iVar5);
  return pUVar4 + 1;
}

Assistant:

const UChar *
UCharsTrie::findUniqueValueFromBranch(const UChar *pos, int32_t length,
                                      UBool haveUniqueValue, int32_t &uniqueValue) {
    while(length>kMaxBranchLinearSubNodeLength) {
        ++pos;  // ignore the comparison unit
        if(NULL==findUniqueValueFromBranch(jumpByDelta(pos), length>>1, haveUniqueValue, uniqueValue)) {
            return NULL;
        }
        length=length-(length>>1);
        pos=skipDelta(pos);
    }
    do {
        ++pos;  // ignore a comparison unit
        // handle its value
        int32_t node=*pos++;
        UBool isFinal=(UBool)(node>>15);
        node&=0x7fff;
        int32_t value=readValue(pos, node);
        pos=skipValue(pos, node);
        if(isFinal) {
            if(haveUniqueValue) {
                if(value!=uniqueValue) {
                    return NULL;
                }
            } else {
                uniqueValue=value;
                haveUniqueValue=TRUE;
            }
        } else {
            if(!findUniqueValue(pos+value, haveUniqueValue, uniqueValue)) {
                return NULL;
            }
            haveUniqueValue=TRUE;
        }
    } while(--length>1);
    return pos+1;  // ignore the last comparison unit
}